

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command *commands,
               size_t *num_commands,size_t *num_literals)

{
  float *pfVar1;
  undefined4 *puVar2;
  float *pfVar3;
  float fVar4;
  ushort uVar5;
  ushort uVar6;
  size_t sVar7;
  uint32_t *puVar8;
  HasherCommon *pHVar9;
  size_t sVar10;
  size_t sVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  void *__dest;
  ulong uVar17;
  ulong uVar18;
  StartPosQueue *queue;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  size_t max_backward_limit;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  undefined4 *puVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  uint8_t *puVar41;
  long lVar42;
  size_t pos;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  float fVar46;
  float fVar47;
  ZopfliNode *nodes;
  ulong local_27e0;
  ulong local_27c0;
  ulong local_27a0;
  void *local_2798;
  ulong local_2780;
  void *local_2778;
  ulong local_2750;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_literal [256];
  uint32_t histogram_cmd [704];
  float cost_literal [256];
  uint32_t histogram_dist [544];
  
  sVar7 = params->stream_offset;
  iVar15 = params->lgwin;
  if (num_bytes == 0) {
    local_2778 = (void *)0x0;
  }
  else {
    local_2778 = BrotliAllocate(m,num_bytes * 4);
  }
  local_2750 = num_bytes * 4;
  local_2798 = (void *)0x0;
  pvVar23 = (void *)(num_bytes - 0x7f);
  if (num_bytes < 0x7f) {
    pvVar23 = local_2798;
  }
  if (local_2750 != 0) {
    local_2798 = BrotliAllocate(m,num_bytes << 5);
  }
  if (3 < num_bytes) {
    uVar19 = (1L << ((byte)iVar15 & 0x3f)) - 0x10;
    lVar42 = 0;
    lVar22 = 0;
    do {
      uVar21 = position + lVar42;
      uVar24 = uVar19;
      if (uVar21 < uVar19) {
        uVar24 = uVar21;
      }
      uVar29 = uVar21 + sVar7;
      if (uVar19 <= uVar29) {
        uVar29 = uVar19;
      }
      uVar17 = lVar22 + 0x80;
      if (local_2750 < uVar17) {
        uVar34 = local_2750;
        if (local_2750 == 0) {
          uVar34 = uVar17;
        }
        do {
          uVar36 = uVar34;
          uVar34 = uVar36 * 2;
        } while (uVar36 < uVar17);
        if (uVar36 == 0) {
          __dest = (void *)0x0;
        }
        else {
          __dest = BrotliAllocate(m,uVar36 * 8);
        }
        if (local_2750 != 0) {
          memcpy(__dest,local_2798,local_2750 << 3);
        }
        BrotliFree(m,local_2798);
        local_2798 = __dest;
        local_2750 = uVar36;
      }
      uVar34 = num_bytes - lVar42;
      uVar36 = uVar21 & ringbuffer_mask;
      uVar17 = 0x10;
      if (params->quality == 0xb) {
        uVar17 = 0x40;
      }
      uVar18 = 0;
      if (uVar17 <= uVar21) {
        uVar18 = uVar21 - uVar17;
      }
      puVar2 = (undefined4 *)((long)local_2798 + lVar22 * 8);
      puVar25 = ringbuffer + uVar36;
      uVar26 = (ulong)((uint)uVar34 & 7);
      uVar39 = 1;
      puVar37 = puVar2;
      uVar17 = uVar21;
      do {
        uVar17 = uVar17 - 1;
        if ((uVar17 <= uVar18) || (2 < uVar39)) break;
        uVar30 = uVar21 - uVar17;
        if ((uVar30 <= uVar24) &&
           ((uVar43 = uVar17 & ringbuffer_mask, *puVar25 == ringbuffer[uVar43] &&
            (puVar25[1] == ringbuffer[uVar43 + 1])))) {
          if (7 < uVar34) {
            lVar40 = 0;
            uVar31 = 0;
LAB_001144cb:
            if (*(ulong *)(puVar25 + uVar31 * 8) == *(ulong *)(ringbuffer + uVar31 * 8 + uVar43))
            goto code_r0x001144d8;
            uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar43) ^ *(ulong *)(puVar25 + uVar31 * 8)
            ;
            uVar43 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
              }
            }
            uVar31 = (uVar43 >> 3 & 0x1fffffff) - lVar40;
            goto LAB_001144fc;
          }
          puVar41 = puVar25;
          uVar44 = 0;
LAB_00114534:
          uVar31 = uVar44;
          if (uVar26 != 0) {
            uVar32 = uVar26 | uVar44;
            uVar33 = uVar26;
            do {
              uVar31 = uVar44;
              if (ringbuffer[uVar44 + uVar43] != *puVar41) break;
              puVar41 = puVar41 + 1;
              uVar44 = uVar44 + 1;
              uVar33 = uVar33 - 1;
              uVar31 = uVar32;
            } while (uVar33 != 0);
          }
LAB_001144fc:
          if (uVar39 < uVar31) {
            *puVar37 = (int)uVar30;
            puVar37[1] = (int)uVar31 << 5;
            puVar37 = puVar37 + 2;
            uVar39 = uVar31;
          }
        }
      } while (uVar30 <= uVar24);
      if (uVar39 < uVar34) {
        uVar14 = (uint)(*(int *)(ringbuffer + uVar36) * 0x1e35a7bd) >> 0xf;
        uVar17 = (hasher->privat)._H5.bucket_size_;
        puVar8 = (hasher->privat)._H2.buckets_;
        pHVar9 = (hasher->privat)._H40.common;
        uVar26 = (ulong)puVar8[uVar14];
        uVar18 = uVar34;
        if (0x7f < uVar34) {
          puVar8[uVar14] = (uint32_t)uVar21;
          uVar18 = 0x80;
        }
        lVar40 = (uVar17 & uVar21) * 2 + 1;
        lVar28 = (uVar17 & uVar21) * 2;
        lVar38 = 0x40;
        local_27a0 = 0;
        local_2780 = 0;
LAB_00114625:
        uVar30 = uVar21 - uVar26;
        if ((uVar30 != 0) && (lVar38 != 0 && uVar30 <= uVar24)) {
          uVar43 = local_2780;
          if (local_27a0 < local_2780) {
            uVar43 = local_27a0;
          }
          puVar25 = ringbuffer + uVar43 + (uVar26 & ringbuffer_mask);
          uVar31 = uVar34 - uVar43;
          if (7 < uVar31) {
            uVar33 = uVar31 & 0xfffffffffffffff8;
            lVar35 = 0;
            uVar44 = 0;
LAB_001146c9:
            if (*(ulong *)(puVar25 + uVar44 * 8) ==
                *(ulong *)(ringbuffer + uVar44 * 8 + uVar43 + uVar36)) goto code_r0x001146d6;
            uVar44 = *(ulong *)(ringbuffer + uVar44 * 8 + uVar43 + uVar36) ^
                     *(ulong *)(puVar25 + uVar44 * 8);
            uVar31 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar44 = (uVar31 >> 3 & 0x1fffffff) - lVar35;
            goto LAB_00114736;
          }
          uVar33 = 0;
          goto LAB_00114819;
        }
        if (0x7f < uVar34) {
          *(int *)((long)&pHVar9->extra + lVar28 * 4) = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)&pHVar9->extra + lVar40 * 4) = (hasher->privat)._H5.hash_shift_;
        }
        bVar45 = false;
        goto LAB_00114659;
      }
LAB_00114874:
      lVar40 = 0;
      do {
        model.cost_cmd_[lVar40] = 2.5243547e-29;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0x26);
      uVar39 = uVar39 + 1;
      if (uVar39 < 5) {
        uVar39 = 4;
      }
      iVar15 = BrotliFindAllStaticDictionaryMatches
                         (&params->dictionary,ringbuffer + uVar36,uVar39,uVar34,(uint32_t *)&model);
      if (iVar15 != 0) {
        if (0x24 < uVar34) {
          uVar34 = 0x25;
        }
        if (uVar39 <= uVar34) {
          iVar15 = (int)uVar39 << 5;
          do {
            fVar46 = model.cost_cmd_[uVar39];
            if (((uint)fVar46 < 0xfffffff) &&
               (uVar24 = (ulong)((uint)fVar46 >> 5) + uVar29 + 1,
               uVar24 <= (params->dist).max_distance)) {
              uVar14 = (uint)fVar46 & 0x1f;
              *puVar37 = (int)uVar24;
              if (uVar39 == uVar14) {
                uVar14 = 0;
              }
              puVar37[1] = uVar14 + iVar15;
              puVar37 = puVar37 + 2;
            }
            uVar39 = uVar39 + 1;
            iVar15 = iVar15 + 0x20;
          } while (uVar34 + 1 != uVar39);
        }
      }
      lVar38 = (long)puVar37 - (long)puVar2 >> 3;
      *(int *)((long)local_2778 + lVar42 * 4) = (int)lVar38;
      lVar40 = lVar22;
      lVar28 = lVar42;
      if (puVar37 != puVar2) {
        lVar40 = lVar38 + lVar22;
        uVar14 = *(uint *)((long)local_2798 + lVar40 * 8 + -4);
        if (0x28bf < uVar14) {
          uVar17 = (ulong)(uVar14 >> 5);
          uVar24 = uVar21 + 1;
          uVar29 = uVar17 + uVar21;
          if ((long)pvVar23 + position <= uVar29) {
            uVar29 = (long)pvVar23 + position;
          }
          uVar34 = uVar29 - 0x3f;
          if (uVar29 < uVar21 + 0x40) {
            uVar34 = uVar24;
          }
          *(undefined8 *)((long)local_2798 + lVar22 * 8) =
               *(undefined8 *)((long)local_2798 + lVar40 * 8 + -8);
          *(undefined4 *)((long)local_2778 + lVar42 * 4) = 1;
          if ((uVar21 + 0x201 <= uVar34) && (uVar24 < uVar34)) {
            uVar21 = (hasher->privat)._H5.bucket_size_;
            puVar8 = (hasher->privat)._H2.buckets_;
            pHVar9 = (hasher->privat)._H40.common;
LAB_00114a3f:
            uVar39 = uVar24 & ringbuffer_mask;
            uVar14 = (uint)(*(int *)(ringbuffer + uVar39) * 0x1e35a7bd) >> 0xf;
            uVar26 = (ulong)puVar8[uVar14];
            uVar36 = (uVar21 & uVar24) * 2 + 1;
            uVar18 = (uVar21 & uVar24) * 2;
            puVar8[uVar14] = (uint32_t)uVar24;
            lVar40 = 0x40;
            local_27c0 = 0;
            local_27e0 = 0;
LAB_00114a93:
            if ((uVar24 != uVar26) && (lVar40 != 0 && uVar24 - uVar26 <= uVar21 - 0xf)) {
              uVar30 = local_27e0;
              if (local_27c0 < local_27e0) {
                uVar30 = local_27c0;
              }
              puVar25 = ringbuffer + uVar30 + (uVar26 & ringbuffer_mask);
              uVar43 = 0x80 - uVar30;
              if (7 < uVar43) {
                uVar44 = uVar43 & 0xfffffffffffffff8;
                lVar28 = 0;
                uVar31 = 0;
LAB_00114b1a:
                if (*(ulong *)(puVar25 + uVar31 * 8) ==
                    *(ulong *)(ringbuffer + uVar31 * 8 + uVar30 + uVar39)) goto code_r0x00114b27;
                uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar30 + uVar39) ^
                         *(ulong *)(puVar25 + uVar31 * 8);
                uVar43 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar31 = (uVar43 >> 3 & 0x1fffffff) - lVar28;
                goto LAB_00114b73;
              }
              uVar44 = 0;
              goto LAB_00114bf5;
            }
            iVar15 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)&pHVar9->extra + uVar18 * 4) = iVar15;
            *(int *)((long)&pHVar9->extra + uVar36 * 4) = iVar15;
            bVar45 = false;
            goto LAB_00114be4;
          }
LAB_00114c3e:
          if (uVar34 < uVar29) {
            uVar21 = (hasher->privat)._H5.bucket_size_;
            puVar8 = (hasher->privat)._H2.buckets_;
            pHVar9 = (hasher->privat)._H40.common;
LAB_00114c63:
            uVar18 = uVar34 & ringbuffer_mask;
            uVar14 = (uint)(*(int *)(ringbuffer + uVar18) * 0x1e35a7bd) >> 0xf;
            uVar39 = (ulong)puVar8[uVar14];
            uVar24 = (uVar21 & uVar34) * 2 + 1;
            uVar36 = (uVar21 & uVar34) * 2;
            puVar8[uVar14] = (uint32_t)uVar34;
            lVar40 = 0x40;
            local_27c0 = 0;
            local_27e0 = 0;
LAB_00114cb8:
            if ((uVar34 != uVar39) && (lVar40 != 0 && uVar34 - uVar39 <= uVar21 - 0xf)) {
              uVar26 = local_27e0;
              if (local_27c0 < local_27e0) {
                uVar26 = local_27c0;
              }
              puVar25 = ringbuffer + uVar26 + (uVar39 & ringbuffer_mask);
              uVar30 = 0x80 - uVar26;
              if (7 < uVar30) {
                uVar31 = uVar30 & 0xfffffffffffffff8;
                lVar28 = 0;
                uVar43 = 0;
LAB_00114d46:
                if (*(ulong *)(puVar25 + uVar43 * 8) ==
                    *(ulong *)(ringbuffer + uVar43 * 8 + uVar26 + uVar18)) goto code_r0x00114d53;
                uVar43 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar26 + uVar18) ^
                         *(ulong *)(puVar25 + uVar43 * 8);
                uVar30 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar43 = (uVar30 >> 3 & 0x1fffffff) - lVar28;
                goto LAB_00114da4;
              }
              uVar31 = 0;
              goto LAB_00114e2b;
            }
            iVar15 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)&pHVar9->extra + uVar36 * 4) = iVar15;
            *(int *)((long)&pHVar9->extra + uVar24 * 4) = iVar15;
            bVar45 = false;
            goto LAB_00114ce0;
          }
LAB_00114e6e:
          lVar28 = uVar17 - 1;
          memset((void *)((long)local_2778 + lVar42 * 4 + 4),0,lVar28 * 4);
          lVar40 = lVar22 + 1;
          lVar28 = lVar42 + lVar28;
        }
      }
      lVar42 = lVar28 + 1;
      lVar22 = lVar40;
    } while (lVar28 + 4U < num_bytes);
  }
  sVar7 = *num_literals;
  sVar10 = *last_insert_len;
  uVar12 = *(undefined8 *)dist_cache;
  uVar13 = *(undefined8 *)(dist_cache + 2);
  sVar11 = *num_commands;
  lVar42 = num_bytes + 1;
  if (lVar42 == 0) {
    queue = (StartPosQueue *)0x0;
  }
  else {
    queue = (StartPosQueue *)BrotliAllocate(m,lVar42 * 0x10);
  }
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  pfVar1 = (float *)(queue->q_[0].distance_cache + 1);
  lVar22 = lVar42;
  pfVar3 = pfVar1;
  lVar40 = 0;
  do {
    for (; lVar22 != 0; lVar22 = lVar22 + -1) {
      *(undefined4 *)&((PosData *)(pfVar3 + -3))->pos = 1;
      pfVar3[-2] = 0.0;
      pfVar3[-1] = 0.0;
      *pfVar3 = 1.7e+38;
      pfVar3 = pfVar3 + 4;
    }
    if (lVar40 == 0) {
      nodes = (ZopfliNode *)0x115190;
      ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar27 = *num_commands;
      memset(histogram_literal,0,0x400);
      memset(histogram_cmd,0,0xb00);
      memset(histogram_dist,0,0x880);
      if (sVar27 != sVar11) {
        lVar22 = 0;
        uVar19 = position - sVar10;
        do {
          uVar29 = (ulong)commands[lVar22].insert_len_;
          uVar14 = commands[lVar22].copy_len_;
          uVar5 = commands[lVar22].dist_prefix_;
          uVar6 = commands[lVar22].cmd_prefix_;
          histogram_cmd[uVar6] = histogram_cmd[uVar6] + 1;
          uVar21 = uVar19;
          uVar24 = uVar29;
          if (0x7f < uVar6) {
            histogram_dist[uVar5 & 0x3ff] = histogram_dist[uVar5 & 0x3ff] + 1;
          }
          for (; uVar24 != 0; uVar24 = uVar24 - 1) {
            histogram_literal[ringbuffer[uVar21 & ringbuffer_mask]] =
                 histogram_literal[ringbuffer[uVar21 & ringbuffer_mask]] + 1;
            uVar21 = uVar21 + 1;
          }
          uVar19 = uVar19 + uVar29 + (ulong)(uVar14 & 0x1ffffff);
          lVar22 = lVar22 + 1;
        } while (lVar22 != sVar27 - sVar11);
      }
      SetCost(histogram_literal,0x100,1,cost_literal);
      SetCost(histogram_cmd,0x2c0,0,model.cost_cmd_);
      nodes = (ZopfliNode *)0x1150f5;
      SetCost(histogram_dist,(ulong)model.distance_histogram_size,0,model.cost_dist_);
      model.min_cost_cmd_ = 1.7e+38;
      lVar22 = 0;
      do {
        if (model.cost_cmd_[lVar22] <= model.min_cost_cmd_) {
          model.min_cost_cmd_ = model.cost_cmd_[lVar22];
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x2c0);
      *model.literal_costs_ = 0.0;
      if (model.num_bytes_ != 0) {
        fVar46 = 0.0;
        sVar27 = 0;
        do {
          fVar4 = cost_literal[ringbuffer[position + sVar27 & ringbuffer_mask]];
          pfVar3 = model.literal_costs_ + sVar27;
          fVar47 = *pfVar3 + fVar46 + fVar4;
          model.literal_costs_[sVar27 + 1] = fVar47;
          sVar27 = sVar27 + 1;
          fVar46 = (fVar46 + fVar4) - (fVar47 - *pfVar3);
        } while (model.num_bytes_ != sVar27);
      }
    }
    *num_commands = sVar11;
    *num_literals = sVar7;
    *last_insert_len = sVar10;
    *(undefined8 *)dist_cache = uVar12;
    *(undefined8 *)(dist_cache + 2) = uVar13;
    iVar15 = params->lgwin;
    uVar14 = 0x145;
    if (params->quality < 0xb) {
      uVar14 = 0x96;
    }
    sVar27 = params->stream_offset;
    *(undefined4 *)&queue->q_[0].pos = 0;
    queue->q_[0].distance_cache[1] = 0;
    histogram_cmd[0x40] = 0;
    histogram_cmd[0x41] = 0;
    if (3 < num_bytes) {
      max_backward_limit = (1L << ((byte)iVar15 & 0x3f)) - 0x10;
      lVar22 = 0;
      pos = 0;
      do {
        sVar20 = UpdateNodes(num_bytes,position,pos,ringbuffer,ringbuffer_mask,params,
                             max_backward_limit,dist_cache,
                             (ulong)*(uint *)((long)local_2778 + pos * 4),
                             (BackwardMatch *)((long)local_2798 + lVar22 * 8),&model,
                             (StartPosQueue *)histogram_cmd,(ZopfliNode *)queue);
        uVar19 = 0;
        if (0x3fff < sVar20) {
          uVar19 = sVar20;
        }
        uVar21 = (ulong)*(uint *)((long)local_2778 + pos * 4);
        lVar22 = lVar22 + uVar21;
        if (((uVar21 == 1) &&
            (uVar16 = *(uint *)((long)local_2798 + lVar22 * 8 + -4) >> 5, uVar14 < uVar16)) &&
           (uVar19 < uVar16)) {
          uVar19 = (ulong)uVar16;
        }
        if (1 < uVar19) {
          lVar28 = uVar19 - 1;
          uVar19 = pos + 4;
          do {
            pos = uVar19 - 3;
            if (num_bytes <= uVar19) break;
            EvaluateNode(sVar27 + position,pos,max_backward_limit,(size_t)dist_cache,(int *)&model,
                         (ZopfliCostModel *)histogram_cmd,queue,nodes);
            lVar22 = lVar22 + (ulong)*(uint *)((long)local_2778 + uVar19 * 4 + -0xc);
            uVar19 = uVar19 + 1;
            lVar28 = lVar28 + -1;
          } while (lVar28 != 0);
        }
        uVar19 = pos + 4;
        pos = pos + 1;
      } while (uVar19 < num_bytes);
    }
    sVar27 = ComputeShortestPathFromNodes(num_bytes,(ZopfliNode *)queue);
    *num_commands = *num_commands + sVar27;
    BrotliZopfliCreateCommands
              (num_bytes,position,(ZopfliNode *)queue,dist_cache,last_insert_len,params,commands,
               num_literals);
    bVar45 = lVar40 != 0;
    lVar22 = lVar42;
    pfVar3 = pfVar1;
    lVar40 = lVar40 + 1;
    if (bVar45) {
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,model.cost_dist_);
      model.cost_dist_ = (float *)0x0;
      BrotliFree(m,queue);
      BrotliFree(m,local_2798);
      BrotliFree(m,local_2778);
      return;
    }
  } while( true );
code_r0x001144d8:
  uVar31 = uVar31 + 1;
  lVar40 = lVar40 + -8;
  puVar41 = puVar25 + (uVar34 & 0xfffffffffffffff8);
  uVar44 = uVar34 & 0xfffffffffffffff8;
  if (uVar34 >> 3 == uVar31) goto LAB_00114534;
  goto LAB_001144cb;
code_r0x001146d6:
  uVar44 = uVar44 + 1;
  lVar35 = lVar35 + -8;
  if (uVar31 >> 3 == uVar44) goto code_r0x001146e2;
  goto LAB_001146c9;
code_r0x001146e2:
  puVar25 = puVar25 + -lVar35;
LAB_00114819:
  uVar31 = uVar31 & 7;
  uVar44 = uVar33;
  if (uVar31 != 0) {
    uVar32 = uVar33 | uVar31;
    do {
      uVar44 = uVar33;
      if (ringbuffer[uVar33 + uVar43 + uVar36] != *puVar25) break;
      puVar25 = puVar25 + 1;
      uVar33 = uVar33 + 1;
      uVar31 = uVar31 - 1;
      uVar44 = uVar32;
    } while (uVar31 != 0);
  }
LAB_00114736:
  uVar44 = uVar44 + uVar43;
  if (puVar37 == (undefined4 *)0x0) {
    puVar37 = (undefined4 *)0x0;
  }
  else if (uVar39 < uVar44) {
    *puVar37 = (int)uVar30;
    puVar37[1] = (int)uVar44 << 5;
    puVar37 = puVar37 + 2;
    uVar39 = uVar44;
  }
  if (uVar44 < uVar18) {
    if (ringbuffer[uVar44 + (uVar26 & ringbuffer_mask)] < ringbuffer[uVar44 + uVar36]) {
      if (0x7f < uVar34) {
        *(int *)((long)&pHVar9->extra + lVar28 * 4) = (int)uVar26;
      }
      lVar35 = (uVar26 & uVar17) * 2 + 1;
      lVar28 = lVar35;
      local_27a0 = uVar44;
    }
    else {
      if (0x7f < uVar34) {
        *(int *)((long)&pHVar9->extra + lVar40 * 4) = (int)uVar26;
      }
      lVar35 = (uVar26 & uVar17) * 2;
      lVar40 = lVar35;
      local_2780 = uVar44;
    }
    uVar26 = (ulong)*(uint *)((long)&pHVar9->extra + lVar35 * 4);
    bVar45 = true;
  }
  else {
    if (0x7f < uVar34) {
      *(undefined4 *)((long)&pHVar9->extra + lVar28 * 4) =
           *(undefined4 *)(&pHVar9->extra + (uVar26 & uVar17));
      *(undefined4 *)((long)&pHVar9->extra + lVar40 * 4) =
           *(undefined4 *)((long)&pHVar9->extra + (uVar26 & uVar17) * 8 + 4);
    }
    bVar45 = false;
  }
LAB_00114659:
  lVar38 = lVar38 + -1;
  if (!bVar45) goto LAB_00114874;
  goto LAB_00114625;
code_r0x00114b27:
  uVar31 = uVar31 + 1;
  lVar28 = lVar28 + -8;
  if (uVar43 >> 3 == uVar31) goto code_r0x00114b33;
  goto LAB_00114b1a;
code_r0x00114b33:
  puVar25 = puVar25 + -lVar28;
LAB_00114bf5:
  uVar43 = uVar43 & 7;
  uVar31 = uVar44;
  if (uVar43 != 0) {
    uVar33 = uVar44 | uVar43;
    do {
      uVar31 = uVar44;
      if (ringbuffer[uVar44 + uVar30 + uVar39] != *puVar25) break;
      puVar25 = puVar25 + 1;
      uVar44 = uVar44 + 1;
      uVar43 = uVar43 - 1;
      uVar31 = uVar33;
    } while (uVar43 != 0);
  }
LAB_00114b73:
  uVar31 = uVar31 + uVar30;
  if (uVar31 < 0x80) {
    uVar30 = (uVar26 & uVar21) * 2;
    if (ringbuffer[uVar31 + (uVar26 & ringbuffer_mask)] < ringbuffer[uVar31 + uVar39]) {
      *(int *)((long)&pHVar9->extra + uVar18 * 4) = (int)uVar26;
      uVar30 = uVar30 | 1;
      uVar18 = uVar30;
      local_27c0 = uVar31;
    }
    else {
      *(int *)((long)&pHVar9->extra + uVar36 * 4) = (int)uVar26;
      uVar36 = uVar30;
      local_27e0 = uVar31;
    }
    uVar26 = (ulong)*(uint *)((long)&pHVar9->extra + uVar30 * 4);
    bVar45 = true;
  }
  else {
    *(undefined4 *)((long)&pHVar9->extra + uVar18 * 4) =
         *(undefined4 *)(&pHVar9->extra + (uVar26 & uVar21));
    *(undefined4 *)((long)&pHVar9->extra + uVar36 * 4) =
         *(undefined4 *)((long)&pHVar9->extra + (uVar26 & uVar21) * 8 + 4);
    bVar45 = false;
  }
LAB_00114be4:
  lVar40 = lVar40 + -1;
  if (!bVar45) goto LAB_00114c27;
  goto LAB_00114a93;
LAB_00114c27:
  uVar24 = uVar24 + 8;
  if (uVar34 <= uVar24) goto LAB_00114c3e;
  goto LAB_00114a3f;
code_r0x00114d53:
  uVar43 = uVar43 + 1;
  lVar28 = lVar28 + -8;
  if (uVar30 >> 3 == uVar43) goto code_r0x00114d5f;
  goto LAB_00114d46;
code_r0x00114d5f:
  puVar25 = puVar25 + -lVar28;
LAB_00114e2b:
  uVar30 = uVar30 & 7;
  uVar43 = uVar31;
  if (uVar30 != 0) {
    uVar44 = uVar31 | uVar30;
    do {
      uVar43 = uVar31;
      if (ringbuffer[uVar31 + uVar26 + uVar18] != *puVar25) break;
      puVar25 = puVar25 + 1;
      uVar31 = uVar31 + 1;
      uVar30 = uVar30 - 1;
      uVar43 = uVar44;
    } while (uVar30 != 0);
  }
LAB_00114da4:
  uVar43 = uVar43 + uVar26;
  if (uVar43 < 0x80) {
    uVar26 = (uVar39 & uVar21) * 2;
    if (ringbuffer[uVar43 + (uVar39 & ringbuffer_mask)] < ringbuffer[uVar43 + uVar18]) {
      *(int *)((long)&pHVar9->extra + uVar36 * 4) = (int)uVar39;
      uVar26 = uVar26 | 1;
      uVar36 = uVar26;
      local_27c0 = uVar43;
    }
    else {
      *(int *)((long)&pHVar9->extra + uVar24 * 4) = (int)uVar39;
      uVar24 = uVar26;
      local_27e0 = uVar43;
    }
    uVar39 = (ulong)*(uint *)((long)&pHVar9->extra + uVar26 * 4);
    bVar45 = true;
  }
  else {
    *(undefined4 *)((long)&pHVar9->extra + uVar36 * 4) =
         *(undefined4 *)(&pHVar9->extra + (uVar39 & uVar21));
    *(undefined4 *)((long)&pHVar9->extra + uVar24 * 4) =
         *(undefined4 *)((long)&pHVar9->extra + (uVar39 & uVar21) * 8 + 4);
    bVar45 = false;
  }
LAB_00114ce0:
  lVar40 = lVar40 + -1;
  if (!bVar45) goto LAB_00114e60;
  goto LAB_00114cb8;
LAB_00114e60:
  uVar34 = uVar34 + 1;
  if (uVar29 <= uVar34) goto LAB_00114e6e;
  goto LAB_00114c63;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  BROTLI_UNUSED(literal_context_lut);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(num_matches) ||
      BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, &model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}